

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O1

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)

{
  long lVar1;
  
  if (pchglist->pchgs != (jpc_pchg_t **)0x0) {
    if (0 < pchglist->numpchgs) {
      lVar1 = 0;
      do {
        jas_free(pchglist->pchgs[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < pchglist->numpchgs);
    }
    jas_free(pchglist->pchgs);
  }
  jas_free(pchglist);
  return;
}

Assistant:

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)
{
	int pchgno;
	if (pchglist->pchgs) {
		for (pchgno = 0; pchgno < pchglist->numpchgs; ++pchgno) {
			jpc_pchg_destroy(pchglist->pchgs[pchgno]);
		}
		jas_free(pchglist->pchgs);
	}
	jas_free(pchglist);
}